

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

FileDescriptor __thiscall
google::OpenObjectFileContainingPcAndGetStartAddress
          (google *this,uint64_t pc,uint64_t *start_address,uint64_t *base_address,
          char *out_file_name,size_t out_file_name_size)

{
  int fd;
  int fd_00;
  uint uVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  char *end;
  ulong uVar5;
  ssize_t sVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  size_t offset;
  char *pcVar10;
  size_t __n;
  char *pcVar11;
  char *pcVar12;
  anon_class_8_1_50ba0494 run;
  long lVar13;
  uint64_t end_address;
  uint64_t file_offset;
  Elf64_Ehdr ehdr;
  char buf [1024];
  ulong local_4b8;
  uint64_t local_4b0;
  long local_4a8;
  long local_4a0;
  int local_478 [4];
  short local_468;
  long local_458;
  ushort local_440;
  char local_438 [1032];
  
  do {
    fd = open("/proc/self/maps",0);
    if (fd != -1) goto LAB_0011ff61;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  *(undefined4 *)this = 0xffffffff;
  goto LAB_00120247;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_0011ff61:
    fd_00 = open("/proc/self/mem",0);
    if (fd_00 != -1) {
      end = local_438;
      offset = 0;
      pcVar11 = end;
      goto LAB_0011ffa9;
    }
  }
  *(undefined4 *)this = 0xffffffff;
  goto LAB_00120240;
LAB_0011ffa9:
  do {
    if (local_438 == pcVar11) {
      sVar6 = ReadFromOffset(fd,local_438,0x400,offset);
      if (0 < sVar6) {
        offset = offset + sVar6;
        pcVar11 = local_438 + sVar6;
        pcVar10 = local_438;
        goto LAB_0012004c;
      }
LAB_0012022f:
      *(undefined4 *)this = 0xffffffff;
      goto LAB_00120239;
    }
    pcVar10 = end + 1;
    if (pcVar11 < pcVar10) {
      abort();
    }
    __n = (long)pcVar11 - (long)pcVar10;
    pvVar4 = memchr(pcVar10,10,__n);
    if (pvVar4 == (void *)0x0) {
      memmove(local_438,pcVar10,__n);
      sVar6 = ReadFromOffset(fd,local_438 + __n,0x400 - __n,offset);
      if (sVar6 < 1) goto LAB_0012022f;
      offset = offset + sVar6;
      pcVar11 = local_438 + __n + sVar6;
      pcVar10 = local_438;
    }
LAB_0012004c:
    end = (char *)memchr(pcVar10,10,(long)pcVar11 - (long)pcVar10);
    if (end == (char *)0x0) goto LAB_0012022f;
    *end = '\0';
    pcVar10 = GetHex(pcVar10,end,start_address);
    if ((((pcVar10 == end) || (*pcVar10 != '-')) ||
        (pcVar10 = GetHex(pcVar10 + 1,end,&local_4b8), pcVar10 == end)) ||
       ((*pcVar10 != ' ' || (pcVar12 = pcVar10 + 1, end <= pcVar12)))) goto LAB_0012022f;
    uVar7 = (long)end - (long)pcVar10;
    uVar5 = 1;
    do {
      if (pcVar10[uVar5] == ' ') {
        uVar7 = uVar5;
        pcVar8 = pcVar10 + uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      pcVar8 = end;
    } while (uVar7 != uVar5);
    if ((uVar7 < 5) || (pcVar8 == end)) goto LAB_0012022f;
    if (((*pcVar12 == 'r') &&
        (sVar6 = ReadFromOffset(fd_00,local_478,0x40,*start_address), sVar6 == 0x40)) &&
       (local_478[0] == 0x464c457f)) {
      if (local_468 == 2) {
        *base_address = 0;
      }
      else if (local_468 == 3) {
        *base_address = *start_address;
        lVar13 = local_458;
        for (uVar7 = (ulong)local_440; uVar7 != 0; uVar7 = uVar7 - 1) {
          sVar6 = ReadFromOffset(fd_00,&local_4b0,0x38,*start_address + lVar13);
          if (((sVar6 == 0x38) && ((int)local_4b0 == 1)) && (local_4a8 == 0)) {
            *base_address = *start_address - local_4a0;
            break;
          }
          lVar13 = lVar13 + 0x38;
        }
      }
    }
  } while (((pc < *start_address) || (local_4b8 <= pc)) ||
          ((*pcVar12 != 'r' || (pcVar10[3] != 'x'))));
  pcVar11 = end;
  pcVar10 = GetHex(pcVar8 + 1,end,&local_4b0);
  iVar2 = -1;
  if ((pcVar10 != end) && (*pcVar10 == ' ')) {
    pcVar12 = pcVar10 + 1;
    run.cursor = pcVar12;
    if (pcVar12 < end) {
      pcVar10 = end + ~(ulong)pcVar10;
      iVar9 = 0;
      do {
        if (*pcVar12 == ' ') {
          iVar9 = iVar9 + 1;
        }
        else {
          run.cursor = pcVar12;
          if (1 < iVar9) break;
        }
        pcVar12 = pcVar12 + 1;
        pcVar10 = pcVar10 + -1;
        run.cursor = end;
      } while (pcVar10 != (char *)0x0);
    }
    if ((run.cursor != end) &&
       (iVar2 = (anonymous_namespace)::
                FailureRetry<google::OpenObjectFileContainingPcAndGetStartAddress(unsigned_long,unsigned_long&,unsigned_long&,char*,unsigned_long)::__2>
                          (run,(int)pcVar11), iVar2 == -1)) {
      strncpy(out_file_name,run.cursor,out_file_name_size);
      out_file_name[out_file_name_size - 1] = '\0';
      iVar2 = -1;
    }
  }
  *(int *)this = iVar2;
LAB_00120239:
  close(fd_00);
LAB_00120240:
  uVar1 = close(fd);
  piVar3 = (int *)(ulong)uVar1;
LAB_00120247:
  return (FileDescriptor)(int)piVar3;
}

Assistant:

static ATTRIBUTE_NOINLINE FileDescriptor
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t& start_address,
                                             uint64_t& base_address,
                                             char* out_file_name,
                                             size_t out_file_name_size) {
  FileDescriptor maps_fd{
      FailureRetry([] { return open("/proc/self/maps", O_RDONLY); })};
  if (!maps_fd) {
    return nullptr;
  }

  FileDescriptor mem_fd{
      FailureRetry([] { return open("/proc/self/mem", O_RDONLY); })};
  if (!mem_fd) {
    return nullptr;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  LineReader reader(maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    const char* cursor;
    const char* eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return nullptr;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char* const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return nullptr;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd.get(), &ehdr, sizeof(ElfW(Ehdr)),
                            start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd.get(), &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (start_address > pc || pc >= end_address) {
      continue;  // We skip this map.  PC isn't in this map.
    }

    // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return nullptr;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    FileDescriptor object_fd{
        FailureRetry([cursor] { return open(cursor, O_RDONLY); })};
    if (!object_fd) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return nullptr;
    }
    return object_fd;
  }
}